

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_8x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  int *piVar2;
  byte bVar3;
  code *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int8_t *piVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong *puVar14;
  bool bVar15;
  __m128i round;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  int iStack_50;
  int iStack_4c;
  code *local_40;
  int8_t *local_38;
  undefined1 auVar18 [16];
  
  uVar12 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  bVar15 = 0xf < tx_type;
  uVar11 = 0xbeaf >> (tx_type & 0x1f);
  uVar9 = 0x7f1f >> (tx_type & 0x1f);
  local_38 = av1_fwd_txfm_shift_ls[6];
  iVar13 = (int)*av1_fwd_txfm_shift_ls[6];
  puVar14 = (ulong *)(input + 4);
  if ((uVar9 & 1) != 0 || bVar15) {
    puVar14 = (ulong *)input;
    input = input + 4;
  }
  lVar10 = (long)stride;
  if ((uVar11 & 1) == 0 && !bVar15) {
    local_c8._0_8_ = *(ulong *)((long)puVar14 + (long)(stride * 3) * 2);
    local_b8._0_8_ = *(ulong *)((long)puVar14 + (long)(stride * 2) * 2);
    local_a8._0_8_ = *(ulong *)((long)puVar14 + lVar10 * 2);
  }
  else {
    local_c8._0_8_ = *puVar14;
    local_b8._0_8_ = *(ulong *)((long)puVar14 + lVar10 * 2);
    local_a8._0_8_ = *(ulong *)((long)puVar14 + (long)(stride * 2) * 2);
    puVar14 = (ulong *)((long)puVar14 + (long)(stride * 3) * 2);
  }
  local_a8._8_8_ = 0;
  local_b8._8_8_ = 0;
  local_c8._8_8_ = 0;
  pcVar4 = *(code **)((long)col_highbd_txfm4x4_arr + uVar12);
  local_40 = *(code **)((long)row_highbd_txfm4x8_arr + uVar12);
  local_98._0_8_ = *puVar14;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_98._0_8_;
  if ((uVar9 & 1) == 0 && !bVar15) {
    auVar17 = pshuflw(auVar16,local_c8,0x1b);
    local_c8._0_8_ = auVar17._0_8_;
    auVar17 = pshuflw(auVar17,local_b8,0x1b);
    local_b8._0_8_ = auVar17._0_8_;
    auVar17 = pshuflw(auVar17,local_a8,0x1b);
    local_a8._0_8_ = auVar17._0_8_;
    auVar16 = pshuflw(auVar17,auVar16,0x1b);
    local_98._0_8_ = auVar16._0_8_;
  }
  auVar16 = pmovsxwd(in_XMM1,local_c8._0_8_);
  auVar17 = pmovsxwd(in_XMM2,local_b8._0_8_);
  auVar21 = pmovsxwd(in_XMM3,local_a8._0_8_);
  auVar24 = pmovsxwd(in_XMM4,local_98._0_8_);
  local_c8._4_4_ = auVar16._4_4_;
  local_c8._0_4_ = auVar16._0_4_ << iVar13;
  local_c8._8_4_ = auVar16._8_4_;
  local_c8._12_4_ = auVar16._12_4_;
  local_b8._0_4_ = auVar17._0_4_ << iVar13;
  local_b8._4_4_ = auVar17._4_4_;
  local_b8._8_4_ = auVar17._8_4_;
  local_b8._12_4_ = auVar17._12_4_;
  local_a8._0_4_ = auVar21._0_4_ << iVar13;
  local_a8._4_4_ = auVar21._4_4_;
  local_a8._8_4_ = auVar21._8_4_;
  local_a8._12_4_ = auVar21._12_4_;
  local_98._0_4_ = auVar24._0_4_ << iVar13;
  local_98._4_4_ = auVar24._4_4_;
  local_98._8_4_ = auVar24._8_4_;
  local_98._12_4_ = auVar24._12_4_;
  if ((uVar11 & 1) == 0 && !bVar15) {
    local_88._0_8_ = *(ulong *)((long)input + (long)(stride * 3) * 2);
    local_78._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    local_68._0_8_ = *(ulong *)((long)input + lVar10 * 2);
  }
  else {
    local_88._0_8_ = *(undefined8 *)input;
    local_78._0_8_ = *(ulong *)((long)input + lVar10 * 2);
    local_68._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    input = (int16_t *)((long)input + (long)(stride * 3) * 2);
  }
  local_68._8_8_ = 0;
  local_78._8_8_ = 0;
  local_88._8_8_ = 0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)input;
  if ((uVar9 & 1) == 0 && !bVar15) {
    auVar16 = pshuflw(auVar17,local_88,0x1b);
    local_88._0_8_ = auVar16._0_8_;
    auVar16 = pshuflw(auVar16,local_78,0x1b);
    local_78._0_8_ = auVar16._0_8_;
    auVar16 = pshuflw(auVar16,local_68,0x1b);
    local_68._0_8_ = auVar16._0_8_;
    auVar17 = pshuflw(auVar16,auVar17,0x1b);
  }
  auVar16 = pmovsxwd(auVar17,local_88._0_8_);
  auVar21 = pmovsxwd(local_b8,local_78._0_8_);
  auVar24 = pmovsxwd(local_a8,local_68._0_8_);
  local_58 = auVar17._0_8_;
  auVar17 = pmovsxwd(local_98,local_58);
  local_88._4_4_ = auVar16._4_4_;
  local_88._0_4_ = auVar16._0_4_ << iVar13;
  local_88._8_4_ = auVar16._8_4_;
  local_88._12_4_ = auVar16._12_4_;
  local_78._4_4_ = auVar21._4_4_;
  local_78._0_4_ = auVar21._0_4_ << iVar13;
  local_78._8_4_ = auVar21._8_4_;
  local_78._12_4_ = auVar21._12_4_;
  local_68._4_4_ = auVar24._4_4_;
  local_68._0_4_ = auVar24._0_4_ << iVar13;
  local_68._8_4_ = auVar24._8_4_;
  local_68._12_4_ = auVar24._12_4_;
  local_58._4_4_ = auVar17._4_4_;
  local_58._0_4_ = auVar17._0_4_ << iVar13;
  iStack_50 = auVar17._8_4_;
  iStack_4c = auVar17._12_4_;
  lVar10 = 0;
  do {
    puVar1 = (undefined8 *)(local_c8 + lVar10);
    (*pcVar4)(puVar1,puVar1,0xd,1);
    uVar5 = *(undefined4 *)(local_b8 + lVar10 + 4);
    uVar7 = *(undefined4 *)(local_a8 + lVar10 + 4);
    uVar6 = *(undefined4 *)(local_98 + lVar10 + 4);
    auVar21._0_8_ =
         CONCAT44(*(undefined4 *)(local_b8 + lVar10 + 8),*(undefined4 *)(local_c8 + lVar10 + 8));
    auVar21._8_4_ = *(undefined4 *)(local_c8 + lVar10 + 0xc);
    auVar21._12_4_ = *(undefined4 *)(local_b8 + lVar10 + 0xc);
    auVar19._0_8_ =
         CONCAT44(*(undefined4 *)(local_98 + lVar10 + 8),*(undefined4 *)(local_a8 + lVar10 + 8));
    auVar19._8_4_ = *(undefined4 *)(local_a8 + lVar10 + 0xc);
    auVar19._12_4_ = *(undefined4 *)(local_98 + lVar10 + 0xc);
    *puVar1 = CONCAT44(*(undefined4 *)(local_b8 + lVar10),*(undefined4 *)puVar1);
    *(ulong *)(local_c8 + lVar10 + 8) =
         CONCAT44(*(undefined4 *)(local_98 + lVar10),*(undefined4 *)(local_a8 + lVar10));
    *(undefined4 *)(local_b8 + lVar10 + 8) = *(undefined4 *)(local_c8 + lVar10 + 4);
    *(undefined4 *)(local_b8 + lVar10 + 0xc) = uVar5;
    *(undefined4 *)(local_a8 + lVar10) = uVar7;
    *(undefined4 *)(local_a8 + lVar10 + 4) = uVar6;
    *(undefined8 *)(local_a8 + lVar10) = auVar21._0_8_;
    *(undefined8 *)(local_a8 + lVar10 + 8) = auVar19._0_8_;
    auVar24._8_8_ = auVar19._8_8_;
    auVar24._0_8_ = auVar21._8_8_;
    *(undefined1 (*) [16])(local_98 + lVar10) = auVar24;
    piVar8 = local_38;
    lVar10 = lVar10 + 0x40;
  } while (lVar10 == 0x40);
  iVar13 = 1 << (~local_38[1] & 0x1fU);
  auVar16 = ZEXT416((uint)-(int)local_38[1]);
  auVar20._0_4_ = local_b8._0_4_ + iVar13 >> auVar16;
  auVar20._4_4_ = local_b8._4_4_ + iVar13 >> auVar16;
  auVar20._8_4_ = local_b8._8_4_ + iVar13 >> auVar16;
  auVar20._12_4_ = local_b8._12_4_ + iVar13 >> auVar16;
  local_c8._4_4_ = local_c8._4_4_ + iVar13 >> auVar16;
  local_c8._0_4_ = local_c8._0_4_ + iVar13 >> auVar16;
  local_c8._8_4_ = local_c8._8_4_ + iVar13 >> auVar16;
  local_c8._12_4_ = local_c8._12_4_ + iVar13 >> auVar16;
  auVar22._0_4_ = local_a8._0_4_ + iVar13 >> auVar16;
  auVar22._4_4_ = local_a8._4_4_ + iVar13 >> auVar16;
  auVar22._8_4_ = local_a8._8_4_ + iVar13 >> auVar16;
  auVar22._12_4_ = local_a8._12_4_ + iVar13 >> auVar16;
  local_98._4_4_ = local_98._4_4_ + iVar13 >> auVar16;
  local_98._0_4_ = local_98._0_4_ + iVar13 >> auVar16;
  local_98._8_4_ = local_98._8_4_ + iVar13 >> auVar16;
  local_98._12_4_ = local_98._12_4_ + iVar13 >> auVar16;
  local_88._4_4_ = local_88._4_4_ + iVar13 >> auVar16;
  local_88._0_4_ = local_88._0_4_ + iVar13 >> auVar16;
  local_88._8_4_ = local_88._8_4_ + iVar13 >> auVar16;
  local_88._12_4_ = local_88._12_4_ + iVar13 >> auVar16;
  local_78._4_4_ = local_78._4_4_ + iVar13 >> auVar16;
  local_78._0_4_ = local_78._0_4_ + iVar13 >> auVar16;
  local_78._8_4_ = local_78._8_4_ + iVar13 >> auVar16;
  local_78._12_4_ = local_78._12_4_ + iVar13 >> auVar16;
  local_68._4_4_ = local_68._4_4_ + iVar13 >> auVar16;
  local_68._0_4_ = local_68._0_4_ + iVar13 >> auVar16;
  local_68._8_4_ = local_68._8_4_ + iVar13 >> auVar16;
  local_68._12_4_ = local_68._12_4_ + iVar13 >> auVar16;
  local_58._4_4_ = iVar13 + local_58._4_4_ >> auVar16;
  local_58._0_4_ = iVar13 + (int)local_58 >> auVar16;
  iStack_50 = iVar13 + iStack_50 >> auVar16;
  iStack_4c = iVar13 + iStack_4c >> auVar16;
  local_b8 = auVar20;
  local_a8 = auVar22;
  (*local_40)(local_c8,coeff,0xd,1);
  auVar18._8_8_ = extraout_XMM1_Qb;
  auVar18._0_8_ = extraout_XMM1_Qa;
  bVar3 = piVar8[2];
  if ((char)bVar3 < '\0') {
    iVar13 = 1 << (~bVar3 & 0x1f);
    lVar10 = 0;
    auVar16 = ZEXT416((uint)-(int)(char)bVar3);
    auVar17 = pmovsxwd(auVar20,0x16a116a116a116a1);
    auVar21 = pmovsxwd(auVar22,0x800080008000800);
    do {
      piVar2 = (int *)((long)coeff + lVar10);
      auVar25._0_4_ = *piVar2 + iVar13 >> auVar16;
      auVar25._4_4_ = piVar2[1] + iVar13 >> auVar16;
      auVar25._8_4_ = piVar2[2] + iVar13 >> auVar16;
      auVar25._12_4_ = piVar2[3] + iVar13 >> auVar16;
      auVar24 = pmulld(auVar25,auVar17);
      piVar2 = (int *)((long)coeff + lVar10);
      *piVar2 = auVar24._0_4_ + auVar21._0_4_ >> 0xc;
      piVar2[1] = auVar24._4_4_ + auVar21._4_4_ >> 0xc;
      piVar2[2] = auVar24._8_4_ + auVar21._8_4_ >> 0xc;
      piVar2[3] = auVar24._12_4_ + auVar21._12_4_ >> 0xc;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x80);
  }
  else {
    lVar10 = 0;
    auVar16 = pmovsxwd(auVar18,0x16a116a116a116a1);
    auVar17 = pmovsxwd(auVar20,0x800080008000800);
    do {
      piVar2 = (int *)((long)coeff + lVar10);
      auVar23._0_4_ = *piVar2 << (int)(char)bVar3;
      auVar23._4_4_ = piVar2[1];
      auVar23._8_4_ = piVar2[2];
      auVar23._12_4_ = piVar2[3];
      auVar21 = pmulld(auVar23,auVar16);
      piVar2 = (int *)((long)coeff + lVar10);
      *piVar2 = auVar21._0_4_ + auVar17._0_4_ >> 0xc;
      piVar2[1] = auVar21._4_4_ + auVar17._4_4_ >> 0xc;
      piVar2[2] = auVar21._8_4_ + auVar17._8_4_ >> 0xc;
      piVar2[3] = auVar21._12_4_ + auVar17._12_4_ >> 0xc;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x80);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x4_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X4];
  const int txw_idx = get_txw_idx(TX_8X4);
  const int txh_idx = get_txh_idx(TX_8X4);
  const int txfm_size_col = tx_size_wide[TX_8X4];
  const int txfm_size_row = tx_size_high[TX_8X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x8_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  load_buffer_8x4(input, in, stride, ud_flip, lr_flip, shift[0]);
  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_4x8_rounding(in, -shift[1]);

  // row tranform
  row_txfm(in, outcoeff128, bitrow, 1);
  av1_round_shift_rect_array_32_sse4_1(outcoeff128, outcoeff128, txfm_size_col,
                                       -shift[2], NewSqrt2);
  (void)bd;
}